

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyIsValidHTMLID(ctmbstr id)

{
  Bool BVar1;
  char *local_20;
  ctmbstr s;
  ctmbstr id_local;
  
  local_20 = id;
  if (id != (ctmbstr)0x0) {
    do {
      if (*local_20 == '\0') {
        return yes;
      }
      BVar1 = prvTidyIsHTMLSpace((int)*local_20);
      local_20 = local_20 + 1;
    } while (BVar1 == no);
  }
  return no;
}

Assistant:

Bool TY_(IsValidHTMLID)(ctmbstr id)
{
    ctmbstr s = id;

    if (!s)
        return no;

    while (*s)
        if (TY_(IsHTMLSpace)(*s++))
            return no;

    return yes;

}